

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O0

int banner_send(LIBSSH2_SESSION *session)

{
  ssize_t sVar1;
  int iVar2;
  ssize_t ret;
  size_t banner_len;
  char *banner;
  LIBSSH2_SESSION *session_local;
  
  banner_len = (size_t)anon_var_dwarf_13616;
  ret = 0x1c;
  if (session->banner_TxRx_state == libssh2_NB_state_idle) {
    if ((session->local).banner != (uchar *)0x0) {
      ret = strlen((char *)(session->local).banner);
      banner_len = (size_t)(session->local).banner;
    }
    session->banner_TxRx_state = libssh2_NB_state_created;
  }
  session->socket_block_directions = session->socket_block_directions & 0xfffffffd;
  iVar2 = 0x4000;
  if ((session->flag).sigpipe != 0) {
    iVar2 = 0;
  }
  sVar1 = (*session->send)(session->socket_fd,(void *)(banner_len + session->banner_TxRx_total_send)
                           ,ret - session->banner_TxRx_total_send,iVar2,&session->abstract);
  if (sVar1 == ret - session->banner_TxRx_total_send) {
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;
    session_local._4_4_ = 0;
  }
  else if ((sVar1 < 0) && (sVar1 != -0xb)) {
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;
    session_local._4_4_ = -0x2b;
  }
  else {
    session->socket_block_directions = 2;
    if (0 < sVar1) {
      session->banner_TxRx_total_send = sVar1 + session->banner_TxRx_total_send;
    }
    session_local._4_4_ = -0x25;
  }
  return session_local._4_4_;
}

Assistant:

static int
banner_send(LIBSSH2_SESSION * session)
{
    char *banner = (char *) LIBSSH2_SSH_DEFAULT_BANNER_WITH_CRLF;
    size_t banner_len = sizeof(LIBSSH2_SSH_DEFAULT_BANNER_WITH_CRLF) - 1;
    ssize_t ret;

    if(session->banner_TxRx_state == libssh2_NB_state_idle) {
        if(session->local.banner) {
            /* setopt_string will have given us our \r\n characters */
            banner_len = strlen((char *) session->local.banner);
            banner = (char *) session->local.banner;
        }
#ifdef LIBSSH2DEBUG
        {
            char banner_dup[256];

            /* Hack and slash to avoid sending CRLF in debug output */
            if(banner_len < 256) {
                memcpy(banner_dup, banner, banner_len - 2);
                banner_dup[banner_len - 2] = '\0';
            }
            else {
                memcpy(banner_dup, banner, 255);
                banner_dup[255] = '\0';
            }

            _libssh2_debug((session, LIBSSH2_TRACE_TRANS,
                           "Sending Banner: %s", banner_dup));
        }
#endif

        session->banner_TxRx_state = libssh2_NB_state_created;
    }

    /* no outgoing block yet! */
    session->socket_block_directions &= ~LIBSSH2_SESSION_BLOCK_OUTBOUND;

    ret = LIBSSH2_SEND(session,
                       banner + session->banner_TxRx_total_send,
                       banner_len - session->banner_TxRx_total_send,
                       LIBSSH2_SOCKET_SEND_FLAGS(session));
    if(ret < 0)
        _libssh2_debug((session, LIBSSH2_TRACE_SOCKET,
                       "Error sending %ld bytes: %ld",
                       (long)(banner_len - session->banner_TxRx_total_send),
                       (long)-ret));
    else
        _libssh2_debug((session, LIBSSH2_TRACE_SOCKET,
                       "Sent %ld/%ld bytes at %p+%ld", (long)ret,
                       (long)(banner_len - session->banner_TxRx_total_send),
                       (void *)banner, (long)session->banner_TxRx_total_send));

    if(ret != (ssize_t)(banner_len - session->banner_TxRx_total_send)) {
        if(ret >= 0 || ret == -EAGAIN) {
            /* the whole packet could not be sent, save the what was */
            session->socket_block_directions =
                LIBSSH2_SESSION_BLOCK_OUTBOUND;
            if(ret > 0)
                session->banner_TxRx_total_send += ret;
            return LIBSSH2_ERROR_EAGAIN;
        }
        session->banner_TxRx_state = libssh2_NB_state_idle;
        session->banner_TxRx_total_send = 0;
        return LIBSSH2_ERROR_SOCKET_RECV;
    }

    /* Set the state back to idle */
    session->banner_TxRx_state = libssh2_NB_state_idle;
    session->banner_TxRx_total_send = 0;

    return 0;
}